

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testIsInfinite<int>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDI;
  Interval<int> b_1;
  int max;
  int min;
  Interval<int> b1;
  int p1;
  int p0;
  Interval<int> b0;
  Interval<int> b;
  Interval<int> in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int iVar3;
  int in_stack_ffffffffffffffcc;
  int iVar4;
  Interval<int> local_30;
  int local_28 [4];
  Interval<int> local_18 [2];
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<int>::Interval((Interval<int> *)0x16f642);
  Imath_3_2::Interval<int>::makeInfinite((Interval<int> *)in_stack_ffffffffffffffc0);
  bVar1 = Imath_3_2::Interval<int>::isInfinite
                    ((Interval<int> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
  ;
  if (!bVar1) {
    __assert_fail("b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x256,"void (anonymous namespace)::testIsInfinite(const char *) [T = int]");
  }
  local_28[3] = 0xffffffff;
  local_28[2] = 1;
  Imath_3_2::Interval<int>::Interval(local_18,local_28 + 3,local_28 + 2);
  bVar1 = Imath_3_2::Interval<int>::isInfinite
                    ((Interval<int> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
  ;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x25e,"void (anonymous namespace)::testIsInfinite(const char *) [T = int]");
  }
  local_28[1] = 2;
  local_28[0] = 4;
  Imath_3_2::Interval<int>::Interval(&local_30,local_28 + 1,local_28);
  bVar1 = Imath_3_2::Interval<int>::isInfinite
                    ((Interval<int> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
  ;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x264,"void (anonymous namespace)::testIsInfinite(const char *) [T = int]");
  }
  iVar4 = 0;
  iVar3 = 2;
  Imath_3_2::Interval<int>::Interval
            ((Interval<int> *)&stack0xffffffffffffffc0,(int *)&stack0xffffffffffffffcc,
             (int *)&stack0xffffffffffffffc8);
  bVar1 = Imath_3_2::Interval<int>::isInfinite((Interval<int> *)CONCAT44(iVar4,iVar3));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x270,"void (anonymous namespace)::testIsInfinite(const char *) [T = int]");
  }
  return;
}

Assistant:

void
testIsInfinite (const char* type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.makeInfinite ();
        assert (b.isInfinite ());
    }

    //
    // Non-empty, has-volume interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (T (-1), T (1));
        assert (!b0.isInfinite ());

        T p0 (2);
        T p1 (4);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        assert (!b1.isInfinite ());
    }

    //
    // Non-empty, no-volume interval.
    //
    {
        T min (0);
        T max (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);

        assert (!b.isInfinite ());
    }
}